

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftlzw.c
# Opt level: O2

FT_Error ft_lzw_check_header(FT_Stream stream)

{
  int iVar1;
  FT_Byte head [2];
  
  iVar1 = FT_Stream_Seek(stream,0);
  if (iVar1 == 0) {
    iVar1 = FT_Stream_Read(stream,head,2);
    if (iVar1 == 0) {
      iVar1 = (uint)(head[1] != 0x9d || head[0] != '\x1f') * 3;
    }
  }
  return iVar1;
}

Assistant:

static FT_Error
  ft_lzw_check_header( FT_Stream  stream )
  {
    FT_Error  error;
    FT_Byte   head[2];


    if ( FT_STREAM_SEEK( 0 )       ||
         FT_STREAM_READ( head, 2 ) )
      goto Exit;

    /* head[0] && head[1] are the magic numbers */
    if ( head[0] != 0x1F ||
         head[1] != 0x9D )
      error = FT_THROW( Invalid_File_Format );

  Exit:
    return error;
  }